

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeNext(BtCursor *pCur,int flags)

{
  ushort uVar1;
  MemPage *pPage;
  int flags_local;
  BtCursor *pCur_local;
  
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  if (pCur->eState == '\0') {
    uVar1 = pCur->ix + 1;
    pCur->ix = uVar1;
    if (uVar1 < pCur->pPage->nCell) {
      if (pCur->pPage->leaf == '\0') {
        pCur_local._4_4_ = moveToLeftmost(pCur);
      }
      else {
        pCur_local._4_4_ = 0;
      }
    }
    else {
      pCur->ix = pCur->ix - 1;
      pCur_local._4_4_ = btreeNext(pCur);
    }
  }
  else {
    pCur_local._4_4_ = btreeNext(pCur);
  }
  return pCur_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNext(BtCursor *pCur, int flags){
  MemPage *pPage;
  UNUSED_PARAMETER( flags );  /* Used in COMDB2 but not native SQLite */
  assert( cursorOwnsBtShared(pCur) );
  assert( flags==0 || flags==1 );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  if( pCur->eState!=CURSOR_VALID ) return btreeNext(pCur);
  pPage = pCur->pPage;
  if( (++pCur->ix)>=pPage->nCell ){
    pCur->ix--;
    return btreeNext(pCur);
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}